

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall ChainstateManager::IsSnapshotActive(ChainstateManager *this)

{
  Chainstate *pCVar1;
  Chainstate *pCVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock57;
  unique_lock<std::recursive_mutex> uStack_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_38,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
             ,0x1829,false);
  pCVar1 = (this->m_snapshot_chainstate)._M_t.
           super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
           super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
           super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  pCVar2 = this->m_active_chainstate;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return pCVar1 != (Chainstate *)0x0 && pCVar2 == pCVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool ChainstateManager::IsSnapshotActive() const
{
    LOCK(::cs_main);
    return m_snapshot_chainstate && m_active_chainstate == m_snapshot_chainstate.get();
}